

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O1

void __thiscall
PreciseMeasurement_conversions_Test::~PreciseMeasurement_conversions_Test
          (PreciseMeasurement_conversions_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PreciseMeasurement, conversions)
{
    auto d1 = 45.0 * precise::ft;
    auto d2 = d1.convert_to_base();
    EXPECT_EQ(d2.units(), precise::m);

    auto d3 = d1.convert_to(precise::in);
    EXPECT_EQ(d3.units(), precise::in);

    EXPECT_EQ(d1, d2);
    EXPECT_EQ(d2, d3);
    EXPECT_EQ(d3, d1);
    EXPECT_EQ(d1, d3);

    auto ud4 = d1.as_unit();
    auto d4 = d1.convert_to(ud4);
    EXPECT_EQ(d4.value(), 1.0);

    constexpr auto d5 = precise::ft * 3.0;
    // convert to base
    EXPECT_EQ(d5.convert_to_base().units(), precise::m);
    static_assert(
        (3.0 * precise::ft).convert_to_base().units().base_units() ==
            precise::m.base_units(),
        "constexpr convert_to_base not working");

    EXPECT_EQ(d5.as_unit(), precise::yd);
    EXPECT_DOUBLE_EQ(quick_convert(1.0, d5.as_unit(), precise::yd), 1.0);
    // static_assert(==1.0, "constexpr convert_to_base not working");
}